

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O2

void __thiscall OmegaOP::algo(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  pointer pdVar1;
  pointer pdVar2;
  double **ppdVar3;
  ulong uVar4;
  uint u;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint v;
  ulong uVar8;
  double dVar9;
  Costs cost;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  local_40 = (ulong)((int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1);
  for (local_60 = 2; local_60 < (uint)local_40; local_60 = local_60 + 1) {
    for (uVar8 = 0; uVar8 != local_48; uVar8 = uVar8 + 1) {
      local_5c = 0;
      local_50 = INFINITY;
      local_58 = 0;
      for (local_54 = 1; local_54 < local_60; local_54 = local_54 + 1) {
        lVar7 = 0;
        for (uVar5 = 0; local_48 != uVar5; uVar5 = uVar5 + 1) {
          uVar4 = (ulong)local_54;
          local_38 = this->Q[uVar5][uVar4];
          ppdVar3 = this->S12P;
          uVar6 = (ulong)local_60;
          dVar9 = Costs::slopeCost(&cost,(double *)((long)this->states + lVar7),this->states + uVar8
                                   ,&local_54,&local_60,*ppdVar3 + uVar4,*ppdVar3 + uVar6,
                                   ppdVar3[1] + uVar4,ppdVar3[1] + uVar6,ppdVar3[2] + uVar4,
                                   ppdVar3[2] + uVar6);
          dVar9 = dVar9 + local_38 + this->penalty;
          if (dVar9 < local_50) {
            local_58 = (uint)uVar5;
            local_50 = dVar9;
            local_5c = local_54;
          }
          lVar7 = lVar7 + 8;
        }
      }
      this->Q[uVar8][local_60] = local_50;
      this->lastChpt[uVar8][local_60] = local_5c;
      this->lastIndState[uVar8][local_60] = local_58;
    }
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algo(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}